

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O3

void duckdb::TemplatedFillLoop<unsigned_char>
               (Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  data_ptr_t pdVar1;
  data_t *pdVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var5;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  SelectionVector *pSVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  UnifiedVectorFormat vdata;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  ulong local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (vector->vector_type == CONSTANT_VECTOR) {
    pdVar2 = vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      if (count != 0) {
        uVar13 = 0;
        do {
          uVar14 = uVar13;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar14 = (ulong)sel->sel_vector[uVar13];
          }
          pdVar1[uVar14] = *pdVar2;
          uVar13 = uVar13 + 1;
        } while (count != uVar13);
      }
    }
    else if (count != 0) {
      uVar13 = 0;
      do {
        uVar14 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)sel->sel_vector[uVar13];
        }
        _Var12._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var12._M_head_impl == (unsigned_long *)0x0) {
          local_a8 = (element_type *)
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,(unsigned_long *)&local_a8);
          pdVar1 = local_78.data;
          pSVar9 = local_78.sel;
          local_78.sel = (SelectionVector *)0x0;
          local_78.data = (data_ptr_t)0x0;
          p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar9;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar1;
          if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var12._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var12._M_head_impl;
        }
        bVar6 = (byte)uVar14 & 0x3f;
        _Var12._M_head_impl[uVar14 >> 6] =
             _Var12._M_head_impl[uVar14 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6)
        ;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    local_90 = (ulong)count;
    Vector::ToUnifiedFormat(vector,local_90,&local_78);
    if (count != 0) {
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar14 = 0;
      uVar13 = local_90;
      do {
        _Var5._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        uVar11 = uVar14;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var5._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar11 = (ulong)*(uint *)((long)_Var5._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar14 * 4);
        }
        uVar15 = uVar14;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)sel->sel_vector[uVar14];
        }
        pdVar1[uVar15] = *(data_t *)((long)(_func_int ***)local_78.data + uVar11);
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          _Var12._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
LAB_003c8fda:
          if (_Var12._M_head_impl != (unsigned_long *)0x0) {
            _Var12._M_head_impl[uVar15 >> 6] =
                 _Var12._M_head_impl[uVar15 >> 6] | 1L << ((byte)uVar15 & 0x3f);
          }
        }
        else {
          _Var12._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0) goto LAB_003c8fda;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var8 = p_Stack_a0;
            peVar7 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar7;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            _Var12._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var12._M_head_impl;
            uVar13 = local_90;
          }
          bVar6 = (byte)uVar15 & 0x3f;
          _Var12._M_head_impl[uVar15 >> 6] =
               _Var12._M_head_impl[uVar15 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}